

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# questpgr.c
# Opt level: O1

void deliver_by_window(qtmsg *qt_msg)

{
  nh_menuitem *pnVar1;
  long lVar2;
  size_t sVar3;
  long lVar4;
  menulist menu;
  char xbuf [256];
  menulist local_138;
  char local_128 [256];
  
  init_menulist(&local_138);
  if (0 < qt_msg->size) {
    lVar4 = 0;
    do {
      dlb_fgets(local_128,0x50,msg_file);
      xcrypt(local_128,in_line);
      convert_line();
      lVar2 = (long)local_138.size;
      if (local_138.size <= local_138.icount) {
        local_138.size = local_138.size * 2;
        local_138.items = (nh_menuitem *)realloc(local_138.items,lVar2 * 0x218);
      }
      pnVar1 = local_138.items + local_138.icount;
      pnVar1->id = 0;
      pnVar1->role = MI_TEXT;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,out_line);
      local_138.icount = local_138.icount + 1;
      sVar3 = strlen(in_line);
      lVar4 = lVar4 + sVar3;
    } while (lVar4 < qt_msg->size);
  }
  display_menu(local_138.items,local_138.icount,(char *)0x0,0,(int *)0x0);
  free(local_138.items);
  return;
}

Assistant:

static void deliver_by_window(struct qtmsg *qt_msg)
{
	long size;
	char xbuf[BUFSZ];
	struct menulist menu;
	init_menulist(&menu);

	for (size = 0; size < qt_msg->size; size += (long)strlen(in_line)) {
	    dlb_fgets(xbuf, 80, msg_file);
	    xcrypt(xbuf, in_line);
	    convert_line();
	    add_menutext(&menu, out_line);
	}
	display_menu(menu.items, menu.icount, NULL, PICK_NONE, NULL);
	free(menu.items);
}